

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ArenaAlign_CeilPtr_Test::TestBody
          (ArenaAlign_CeilPtr_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ArenaAlign align_64;
  char p [129];
  AssertHelper local_2a0;
  Message local_298;
  char *local_290;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_288;
  EqMatcher<char_*> local_280;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  char *local_258;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_250;
  EqMatcher<char_*> local_248;
  AssertionResult local_240;
  AssertHelper local_230;
  Message local_228;
  char *local_220;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_218;
  EqMatcher<char_*> local_210;
  AssertionResult local_208;
  AssertHelper local_1f8;
  Message local_1f0;
  char *local_1e8;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_1e0;
  EqMatcher<char_*> local_1d8;
  AssertionResult local_1d0;
  AssertHelper local_1c0;
  Message local_1b8;
  char *local_1b0;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_1a8;
  EqMatcher<char_*> local_1a0;
  AssertionResult local_198;
  AssertHelper local_188;
  Message local_180;
  char *local_178;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_170;
  EqMatcher<char_*> local_168;
  AssertionResult local_160;
  AssertHelper local_150 [3];
  Message local_138;
  char *local_130;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_128;
  EqMatcher<char_*> local_120;
  AssertionResult local_118;
  ArenaAlign local_108;
  char local_100;
  char acStack_ff [62];
  char cStack_c1;
  char cStack_c0;
  char acStack_bf [62];
  char cStack_81;
  char acStack_80 [120];
  
  memset(&local_100,0,0x81);
  local_108 = ArenaAlignAs(0x40);
  local_128.rhs_ = (char *)testing::Eq<char*>(&local_100);
  local_120.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_128.rhs_);
  local_130 = ArenaAlign::Ceil<char>(&local_108,&local_100);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (&local_118,(char *)&local_120,(char **)"align_64.Ceil(p + 0)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message(&local_118);
    testing::internal::AssertHelper::AssertHelper
              (local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x98,pcVar2);
    testing::internal::AssertHelper::operator=(local_150,&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_150);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult(&local_118);
  local_170.rhs_ = (char *)testing::Eq<char*>(&cStack_c0);
  local_168.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_170.rhs_);
  local_178 = ArenaAlign::Ceil<char>(&local_108,acStack_ff);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (&local_160,(char *)&local_168,(char **)"align_64.Ceil(p + 1)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_160);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar2 = testing::AssertionResult::failure_message(&local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x99,pcVar2);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult(&local_160);
  local_1a8.rhs_ = (char *)testing::Eq<char*>(&cStack_c0);
  local_1a0.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_1a8.rhs_);
  local_1b0 = ArenaAlign::Ceil<char>(&local_108,&cStack_c1);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (&local_198,(char *)&local_1a0,(char **)"align_64.Ceil(p + 63)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message(&local_198);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x9a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult(&local_198);
  local_1e0.rhs_ = (char *)testing::Eq<char*>(&cStack_c0);
  local_1d8.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_1e0.rhs_);
  local_1e8 = ArenaAlign::Ceil<char>(&local_108,&cStack_c0);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (&local_1d0,(char *)&local_1d8,(char **)"align_64.Ceil(p + 64)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar2 = testing::AssertionResult::failure_message(&local_1d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult(&local_1d0);
  local_218.rhs_ = (char *)testing::Eq<char*>(acStack_80);
  local_210.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_218.rhs_);
  local_220 = ArenaAlign::Ceil<char>(&local_108,acStack_bf);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (&local_208,(char *)&local_210,(char **)"align_64.Ceil(p + 65)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar2 = testing::AssertionResult::failure_message(&local_208);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x9c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult(&local_208);
  local_250.rhs_ = (char *)testing::Eq<char*>(acStack_80);
  local_248.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_250.rhs_);
  local_258 = ArenaAlign::Ceil<char>(&local_108,&cStack_81);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (&local_240,(char *)&local_248,(char **)"align_64.Ceil(p + 127)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_240);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message(&local_240);
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult(&local_240);
  local_288.rhs_ = (char *)testing::Eq<char*>(acStack_80);
  local_280.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_288.rhs_);
  local_290 = ArenaAlign::Ceil<char>(&local_108,acStack_80);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (&local_278,(char *)&local_280,(char **)"align_64.Ceil(p + 128)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar2 = testing::AssertionResult::failure_message(&local_278);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult(&local_278);
  return;
}

Assistant:

TEST(ArenaAlign, CeilPtr) {
  alignas(64) char p[129] = {0};
  auto align_64 = ArenaAlignAs(64);
  EXPECT_THAT(align_64.Ceil(p + 0), Eq(p));
  EXPECT_THAT(align_64.Ceil(p + 1), Eq(p + 64));
  EXPECT_THAT(align_64.Ceil(p + 63), Eq(p + 64));
  EXPECT_THAT(align_64.Ceil(p + 64), Eq(p + 64));
  EXPECT_THAT(align_64.Ceil(p + 65), Eq(p + 128));
  EXPECT_THAT(align_64.Ceil(p + 127), Eq(p + 128));
  EXPECT_THAT(align_64.Ceil(p + 128), Eq(p + 128));
}